

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v2.cpp
# Opt level: O0

void __thiscall intel_keym_v2_t::km_hash_t::~km_hash_t(km_hash_t *this)

{
  km_hash_t *this_local;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__km_hash_t_00229a80;
  _clean_up(this);
  std::__cxx11::string::~string((string *)&this->m_hash);
  kaitai::kstruct::~kstruct(&this->super_kstruct);
  return;
}

Assistant:

intel_keym_v2_t::km_hash_t::~km_hash_t() {
    _clean_up();
}